

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::StartSenderReport
          (RTCPCompoundPacketBuilder *this,uint32_t senderssrc,RTPNTPTime *ntptimestamp,
          uint32_t rtptimestamp,uint32_t packetcount,uint32_t octetcount)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint *puVar4;
  int iVar5;
  size_t sVar6;
  
  if (this->arebuilding == true) {
    if ((this->report).headerlength == 0) {
      sVar2 = this->appsize;
      sVar3 = this->byesize;
      sVar6 = SDES::NeededBytes(&this->sdes);
      if (this->maximumpacketsize - (sVar6 + sVar2 + sVar3) < 0x1c) {
        iVar5 = -0x2b;
      }
      else {
        (this->report).headerlength = 0x18;
        (this->report).isSR = true;
        puVar4 = (uint *)(this->report).headerdata;
        *puVar4 = senderssrc >> 0x18 | (senderssrc & 0xff0000) >> 8 | (senderssrc & 0xff00) << 8 |
                  senderssrc << 0x18;
        uVar1 = ntptimestamp->msw;
        puVar4[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = ntptimestamp->lsw;
        puVar4[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        puVar4[3] = rtptimestamp >> 0x18 | (rtptimestamp & 0xff0000) >> 8 |
                    (rtptimestamp & 0xff00) << 8 | rtptimestamp << 0x18;
        puVar4[4] = packetcount >> 0x18 | (packetcount & 0xff0000) >> 8 |
                    (packetcount & 0xff00) << 8 | packetcount << 0x18;
        puVar4[5] = octetcount >> 0x18 | (octetcount & 0xff0000) >> 8 | (octetcount & 0xff00) << 8 |
                    octetcount << 0x18;
        iVar5 = 0;
      }
    }
    else {
      iVar5 = -0x21;
    }
    return iVar5;
  }
  return -0x2a;
}

Assistant:

int RTCPCompoundPacketBuilder::StartSenderReport(uint32_t senderssrc,const RTPNTPTime &ntptimestamp,uint32_t rtptimestamp,
                                                 uint32_t packetcount,uint32_t octetcount)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (report.headerlength != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYGOTREPORT;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalsize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalsize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sizeleft = maximumpacketsize-totalsize;
	size_t neededsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)+sizeof(RTCPSenderReport);
	
	if (neededsize > sizeleft)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;
	
	// fill in some things

	report.headerlength = sizeof(uint32_t)+sizeof(RTCPSenderReport);
	report.isSR = true;	
	
	uint32_t *ssrc = (uint32_t *)report.headerdata;
	*ssrc = htonl(senderssrc);

	RTCPSenderReport *sr = (RTCPSenderReport *)(report.headerdata + sizeof(uint32_t));
	sr->ntptime_msw = htonl(ntptimestamp.GetMSW());
	sr->ntptime_lsw = htonl(ntptimestamp.GetLSW());
	sr->rtptimestamp = htonl(rtptimestamp);
	sr->packetcount = htonl(packetcount);
	sr->octetcount = htonl(octetcount);

	return 0;
}